

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessGenSpacingQueryCase::iterate
          (TessGenSpacingQueryCase *this)

{
  TestLog *pTVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  int iVar3;
  undefined4 extraout_var;
  ProgramSources *pPVar4;
  ProgramSources *pPVar5;
  char *code;
  char *globalLayouts;
  char *globalLayouts_00;
  char *pcVar6;
  void *this_00;
  ShaderSource *shaderSource;
  ScopedLogSection section;
  CallLogWrapper gl;
  undefined1 local_3c0 [40];
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  undefined1 local_318 [40];
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  undefined1 local_270 [40];
  undefined1 local_248 [40];
  ResultCollector result;
  ProgramSources local_1d0;
  ShaderProgram program;
  
  pTVar1 = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program," // ERROR: ",(allocator<char> *)&local_1d0);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  iVar3 = (*((this->super_TessProgramQueryCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log);
  checkTessellationSupport((this->super_TessProgramQueryCase).super_TestCase.m_context);
  gl.m_enableLog = true;
  for (pcVar6 = (char *)0x10; pcVar6 != (char *)0x70; pcVar6 = pcVar6 + 0x18) {
    pTVar1 = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,"Type",(allocator<char> *)local_3c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,*(char **)(pcVar6 + 0x1e481b0),(allocator<char> *)local_318);
    pPVar5 = &local_1d0;
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)&local_1d0)
    ;
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&program);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    renderCtx = pCVar2->m_renderCtx;
    this_00 = (void *)0x0;
    memset(&local_1d0,0,0xac);
    local_1d0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_1d0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_1d0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_1d0._193_8_ = 0;
    Functional::(anonymous_namespace)::TessProgramQueryCase::getVertexSource_abi_cxx11_
              (&local_338,this_00);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_290,(_anonymous_namespace_ *)pCVar2,(Context *)local_338._M_dataplus._M_p,
               (char *)pPVar5);
    shaderSource = (ShaderSource *)local_3c0;
    glu::VertexSource::VertexSource((VertexSource *)shaderSource,&local_290);
    pPVar4 = glu::ProgramSources::operator<<(&local_1d0,shaderSource);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    Functional::(anonymous_namespace)::TessProgramQueryCase::getFragmentSource_abi_cxx11_
              (&local_358,shaderSource);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2b0,(_anonymous_namespace_ *)pCVar2,(Context *)local_358._M_dataplus._M_p,
               (char *)pPVar5);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_318,&local_2b0);
    pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_318);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    Functional::(anonymous_namespace)::TessProgramQueryCase::getTessCtrlSource_abi_cxx11_
              (&local_378,"layout(vertices=6) out",globalLayouts);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2d0,(_anonymous_namespace_ *)pCVar2,(Context *)local_378._M_dataplus._M_p,
               (char *)pPVar5);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_248,&local_2d0);
    pPVar5 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_248);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    code = pcVar6;
    Functional::(anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
              (&local_398,*(void **)(pcVar6 + 0x1e481b8),globalLayouts_00);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2f0,(_anonymous_namespace_ *)pCVar2,(Context *)local_398._M_dataplus._M_p,code
              );
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_270,&local_2f0);
    pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_270);
    glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar5);
    std::__cxx11::string::~string((string *)(local_270 + 8));
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)(local_248 + 8));
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)(local_318 + 8));
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)(local_3c0 + 8));
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_338);
    glu::ProgramSources::~ProgramSources(&local_1d0);
    glu::operator<<(((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode
                    .m_testCtx)->m_log,&program);
    if (program.m_program.m_info.linkOk == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"failed to build program",(allocator<char> *)local_3c0);
      tcu::ResultCollector::fail(&result,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    else {
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                (&result,&gl,program.m_program.m_program,0x8e77,*(int *)(pcVar6 + 0x1e481c0),
                 QUERY_PROGRAM_INTEGER);
    }
    glu::ShaderProgram::~ShaderProgram(&program);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode
                     .m_testCtx);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  tcu::ResultCollector::~ResultCollector(&result);
  return STOP;
}

Assistant:

TessGenSpacingQueryCase::IterateResult TessGenSpacingQueryCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	static const struct
	{
		const char* description;
		const char* layout;
		glw::GLenum spacing;
	} s_modes[] =
	{
		{ "Default spacing",			"layout(triangles) in",								GL_EQUAL			},
		{ "Equal spacing",				"layout(triangles, equal_spacing) in",				GL_EQUAL			},
		{ "Fractional even spacing",	"layout(triangles, fractional_even_spacing) in",	GL_FRACTIONAL_EVEN	},
		{ "Fractional odd spacing",		"layout(triangles, fractional_odd_spacing) in",		GL_FRACTIONAL_ODD	},
	};

	checkTessellationSupport(m_context);
	gl.enableLogging(true);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_modes); ++ndx)
	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Type", s_modes[ndx].description);

		glu::ShaderProgram program (m_context.getRenderContext(), glu::ProgramSources()
																	<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																	<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																	<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource("layout(vertices=6) out").c_str()))
																	<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource(s_modes[ndx].layout).c_str())));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			result.fail("failed to build program");
		else
			verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, s_modes[ndx].spacing, QUERY_PROGRAM_INTEGER);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}